

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeFramebufferCase::init
          (NegativeFramebufferCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *this_00;
  int iVar1;
  bool bVar2;
  deBool dVar3;
  int extraout_EAX;
  TestError *pTVar4;
  reference pvVar5;
  size_type sVar6;
  NotSupportedError *pNVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  allocator<char> local_d9;
  string local_d8;
  int local_b4;
  int local_b0;
  int rboNdx_1;
  int texNdx_1;
  undefined4 local_88;
  int local_84;
  int local_80;
  int rboNdx;
  int texNdx;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> rboSamples;
  vector<int,_std::allocator<int>_> textureSamples;
  bool useDifferentSampleCounts;
  bool colorAttachmentRbo;
  bool colorAttachmentTexture;
  NegativeFramebufferCase *this_local;
  
  bVar8 = true;
  if (this->m_caseType != CASE_DIFFERENT_N_SAMPLES_TEX) {
    bVar8 = this->m_caseType == CASE_DIFFERENT_FIXED_TEX;
  }
  bVar9 = true;
  if (this->m_caseType != CASE_DIFFERENT_N_SAMPLES_RBO) {
    bVar9 = this->m_caseType == CASE_DIFFERENT_FIXED_RBO;
  }
  bVar10 = true;
  if (this->m_caseType != CASE_DIFFERENT_N_SAMPLES_TEX) {
    bVar10 = this->m_caseType == CASE_DIFFERENT_N_SAMPLES_RBO;
  }
  this_00 = &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  getFormatSamples(this,0x9100,(vector<int,_std::allocator<int>_> *)this_00);
  getFormatSamples(this,0x8d41,(vector<int,_std::allocator<int>_> *)local_48);
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) ||
       (bVar2 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), bVar2)) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"!textureSamples.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                 ,0x64e);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) ||
       (bVar2 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)local_48), bVar2)) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"!rboSamples.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                 ,0x64f);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if (bVar10) {
    if (bVar8) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      this->m_numSamples0 = *pvVar5;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar6 < 2) {
        rboNdx._2_1_ = 1;
        pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texNdx,"Test requires multiple supported sample counts",
                   (allocator<char> *)((long)&rboNdx + 3));
        tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)&texNdx);
        rboNdx._2_1_ = 0;
        __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1);
      this->m_numSamples1 = *pvVar5;
    }
    else if (bVar9) {
      local_80 = 0;
      do {
        iVar1 = local_80;
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if ((int)sVar6 <= iVar1) {
          rboNdx_1._2_1_ = 1;
          pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&texNdx_1,"Test requires multiple supported sample counts",
                     (allocator<char> *)((long)&rboNdx_1 + 3));
          tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)&texNdx_1);
          rboNdx_1._2_1_ = 0;
          __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        for (local_84 = 0; iVar1 = local_84,
            sVar6 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_48), iVar1 < (int)sVar6;
            local_84 = local_84 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_80);
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,(long)local_84);
          if (iVar1 != *pvVar5) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)local_80);
            this->m_numSamples0 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_48,(long)local_84);
            this->m_numSamples1 = *pvVar5;
            local_88 = 1;
            goto LAB_021f932e;
          }
        }
        local_80 = local_80 + 1;
      } while( true );
    }
  }
  else if (bVar8) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    this->m_numSamples0 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    this->m_numSamples1 = *pvVar5;
  }
  else {
    if (bVar9) {
      local_b0 = 0;
      do {
        iVar1 = local_b0;
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if ((int)sVar6 <= iVar1) {
          pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,
                     "Test requires a sample count supported in both rbo and texture",&local_d9);
          tcu::NotSupportedError::NotSupportedError(pNVar7,&local_d8);
          __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
        for (local_b4 = 0; iVar1 = local_b4,
            sVar6 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_48), iVar1 < (int)sVar6;
            local_b4 = local_b4 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_b0);
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,(long)local_b4);
          if (iVar1 == *pvVar5) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)local_b0);
            this->m_numSamples0 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_48,(long)local_b4);
            this->m_numSamples1 = *pvVar5;
            local_88 = 1;
            goto LAB_021f932e;
          }
        }
        local_b0 = local_b0 + 1;
      } while( true );
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    this->m_numSamples0 = *pvVar5;
  }
  local_88 = 0;
LAB_021f932e:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void NegativeFramebufferCase::init (void)
{
	const bool				colorAttachmentTexture	= (m_caseType == CASE_DIFFERENT_N_SAMPLES_TEX) || (m_caseType == CASE_DIFFERENT_FIXED_TEX);
	const bool				colorAttachmentRbo		= (m_caseType == CASE_DIFFERENT_N_SAMPLES_RBO) || (m_caseType == CASE_DIFFERENT_FIXED_RBO);
	const bool				useDifferentSampleCounts= (m_caseType == CASE_DIFFERENT_N_SAMPLES_TEX) || (m_caseType == CASE_DIFFERENT_N_SAMPLES_RBO);
	std::vector<int>		textureSamples;
	std::vector<int>		rboSamples;

	getFormatSamples(GL_TEXTURE_2D_MULTISAMPLE, textureSamples);
	getFormatSamples(GL_RENDERBUFFER, rboSamples);

	TCU_CHECK(!textureSamples.empty());
	TCU_CHECK(!rboSamples.empty());

	// select sample counts

	if (useDifferentSampleCounts)
	{
		if (colorAttachmentTexture)
		{
			m_numSamples0 = textureSamples[0];

			if (textureSamples.size() >= 2)
				m_numSamples1 = textureSamples[1];
			else
				throw tcu::NotSupportedError("Test requires multiple supported sample counts");
		}
		else if (colorAttachmentRbo)
		{
			for (int texNdx = 0; texNdx < (int)textureSamples.size(); ++texNdx)
			for (int rboNdx = 0; rboNdx < (int)rboSamples.size(); ++rboNdx)
			{
				if (textureSamples[texNdx] != rboSamples[rboNdx])
				{
					m_numSamples0 = textureSamples[texNdx];
					m_numSamples1 = rboSamples[rboNdx];
					return;
				}
			}

			throw tcu::NotSupportedError("Test requires multiple supported sample counts");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
	else
	{
		if (colorAttachmentTexture)
		{
			m_numSamples0 = textureSamples[0];
			m_numSamples1 = textureSamples[0];
		}
		else if (colorAttachmentRbo)
		{
			for (int texNdx = 0; texNdx < (int)textureSamples.size(); ++texNdx)
			for (int rboNdx = 0; rboNdx < (int)rboSamples.size(); ++rboNdx)
			{
				if (textureSamples[texNdx] == rboSamples[rboNdx])
				{
					m_numSamples0 = textureSamples[texNdx];
					m_numSamples1 = rboSamples[rboNdx];
					return;
				}
			}

			throw tcu::NotSupportedError("Test requires a sample count supported in both rbo and texture");
		}
		else
		{
			m_numSamples0 = textureSamples[0];
		}
	}
}